

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O1

void prod_histo(qnode_ptr_t f,char *c_fn,char *h_fn,int nbin,float incr,float *ttl_err,
               float *ttl_std,float *dens)

{
  int iVar1;
  disp_field512_t *padVar2;
  param512_t *papVar3;
  ulong uVar4;
  int iVar5;
  qnode_ptr_t ptVar6;
  long lVar7;
  FILE *__stream;
  int extraout_EDX;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int *piVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  char *pcVar15;
  qnode_ptr_t q;
  qnode_ptr_t q_00;
  int iVar16;
  long lVar17;
  ulong uVar18;
  int y;
  ulong uVar19;
  float fVar20;
  undefined4 in_XMM0_Db;
  double dVar21;
  float fVar22;
  double dVar23;
  histo_t c_histo1 [100];
  histo_t histo1 [100];
  int iStack_a98;
  int iStack_a34;
  float fStack_a30;
  float fStack_a2c;
  ulong uStack_a28;
  qnode_ptr_t ptStack_a20;
  double dStack_a18;
  ulong uStack_a10;
  ulong uStack_a08;
  code *pcStack_a00;
  char *local_9f8;
  undefined8 local_9f0;
  double local_9e8;
  float local_9e0;
  float local_9dc;
  float *local_9d8;
  ulong local_9d0;
  disp_field512_t *local_9c8;
  float local_9bc;
  float *local_9b8;
  long local_9b0;
  float *local_9a8;
  qnode_ptr_t local_9a0;
  float local_998 [2];
  int local_990 [298];
  float local_4e8 [2];
  int local_4e0 [300];
  
  local_9f0 = (double)CONCAT44(in_XMM0_Db,incr);
  local_9a8 = dens;
  iVar5 = f->res;
  uVar10._0_4_ = f->sizx;
  uVar10._4_4_ = f->sizy;
  uVar9 = f->sizz;
  uVar19 = (ulong)uVar9;
  pcStack_a00 = (code *)0x104c10;
  local_9f8 = c_fn;
  local_9d8 = ttl_std;
  local_9b8 = ttl_err;
  local_9a0 = (qnode_ptr_t)h_fn;
  ptVar6 = (qnode_ptr_t)malloc(0x170);
  ptVar6->res = iVar5;
  ptVar6->sizx = (undefined4)uVar10;
  ptVar6->sizy = uVar10._4_4_;
  ptVar6->sizz = uVar9;
  ptVar6->ofst = 0;
  ptVar6->level = 0;
  pcStack_a00 = (code *)0x104c35;
  local_9b0 = (long)iVar5;
  local_9c8 = (disp_field512_t *)malloc(0xc3080);
  ptVar6->flow_ptr = local_9c8;
  pcStack_a00 = (code *)0x104c4d;
  load_velocity(ptVar6,local_9f8);
  local_9e0 = (float)nbin;
  uVar18 = 0;
  pcStack_a00 = (code *)0x104c72;
  memset(local_4e8,0,0x4b0);
  pcStack_a00 = (code *)0x104c83;
  memset(local_998,0,0x4b0);
  local_9bc = (float)local_9f0;
  fVar22 = local_9e0 * local_9bc;
  *local_9b8 = 0.0;
  *local_9d8 = 0.0;
  local_9f8 = (char *)CONCAT44(local_9f8._4_4_,fVar22);
  local_9e8 = (double)(ulong)(uint)nbin;
  if (KERNEL_Y + 9 < (f->sizy - KERNEL_Y) + -9) {
    local_9dc = (float)(nbin - 1);
    lVar14 = (long)KERNEL_Y + 9;
    local_9f0 = (double)((ulong)local_9f0._4_4_ << 0x20);
    uVar18 = 0;
    uVar19 = 0;
    do {
      if (KERNEL_X + 9 < (f->sizx - KERNEL_X) + -9) {
        local_9d0 = lVar14 * local_9b0;
        lVar17 = (long)KERNEL_X + 9;
        do {
          lVar7 = f->res * lVar14 + lVar17;
          padVar2 = f->flow_ptr;
          fVar20 = (*padVar2)[lVar7].x;
          if (((fVar20 != -100.0) || (NAN(fVar20))) &&
             ((fVar20 = (*padVar2)[lVar7].y, fVar20 != 100.0 || (NAN(fVar20))))) {
            fVar22 = (float)(int)(((*f->param_ptr[f->sizz / 2])[lVar7].mag / fVar22) * local_9e0);
            pcStack_a00 = (code *)0x104daf;
            fVar20 = psi_error((*padVar2)[lVar7],(*local_9c8)[local_9d0 + lVar17]);
            local_9f0 = (double)CONCAT44(local_9f0._4_4_,(float)local_9f0 + fVar20);
            uVar19 = (ulong)((int)uVar19 + 1);
            if (local_9e8._0_4_ <= (int)fVar22) {
              fVar22 = local_9dc;
            }
            uVar10 = (ulong)(uint)fVar22;
            lVar7 = (long)(int)fVar22;
            local_4e8[lVar7 * 3 + 1] = local_4e8[lVar7 * 3 + 1] + fVar20;
            local_4e0[lVar7 * 3] = local_4e0[lVar7 * 3] + 1;
            if (-1 < (int)fVar22) {
              lVar7 = 0;
              do {
                *(float *)((long)local_998 + lVar7 + 4) =
                     *(float *)((long)local_998 + lVar7 + 4) + fVar20;
                *(int *)((long)local_990 + lVar7) = *(int *)((long)local_990 + lVar7) + 1;
                lVar7 = lVar7 + 0xc;
              } while (uVar10 * 0xc + 0xc != lVar7);
            }
            fVar22 = local_9f8._0_4_;
          }
          uVar18 = (ulong)((int)uVar18 + 1);
          lVar17 = lVar17 + 1;
        } while (lVar17 < (f->sizx - KERNEL_X) + -9);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (f->sizy - KERNEL_Y) + -9);
    local_9dc = (float)(int)uVar19;
  }
  else {
    local_9f0 = (double)((ulong)local_9f0._4_4_ << 0x20);
    local_9dc = 0.0;
  }
  iVar5 = KERNEL_Y;
  fVar22 = 0.0;
  if ((int)uVar18 != 0) {
    fVar22 = local_9dc / (float)(int)uVar18;
  }
  *local_9a8 = fVar22;
  fVar22 = (float)local_9f0 / local_9dc;
  local_9f0 = (double)CONCAT44(local_9f0._4_4_,fVar22);
  *local_9b8 = fVar22;
  local_9d0 = (ulong)local_9e8 & 0xffffffff;
  if (0 < SUB84(local_9e8,0)) {
    lVar14 = 0;
    do {
      if (*(int *)((long)local_4e0 + lVar14) != 0) {
        *(float *)((long)local_4e8 + lVar14 + 4) =
             *(float *)((long)local_4e8 + lVar14 + 4) / (float)*(int *)((long)local_4e0 + lVar14);
      }
      if (*(int *)((long)local_990 + lVar14) != 0) {
        *(float *)((long)local_998 + lVar14 + 4) =
             *(float *)((long)local_998 + lVar14 + 4) / (float)*(int *)((long)local_990 + lVar14);
      }
      lVar14 = lVar14 + 0xc;
    } while (local_9d0 * 0xc != lVar14);
  }
  if (iVar5 + 9 < (f->sizy - KERNEL_Y) + -9) {
    uVar9 = SUB84(local_9e8,0) - 1;
    uVar10 = (ulong)uVar9;
    uVar18 = (ulong)(iVar5 + 9);
    do {
      uVar19 = (ulong)KERNEL_X;
      if (KERNEL_X + 9 < (f->sizx - KERNEL_X) + -9) {
        lVar14 = uVar18 * local_9b0;
        uVar19 = uVar19 + 9;
        do {
          lVar17 = (long)f->res * uVar18 + uVar19;
          padVar2 = f->flow_ptr;
          fVar22 = (*padVar2)[lVar17].x;
          if (((fVar22 != -100.0) || (NAN(fVar22))) &&
             ((fVar22 = (*padVar2)[lVar17].y, fVar22 != 100.0 || (NAN(fVar22))))) {
            uVar12 = (uint)(((*f->param_ptr[f->sizz / 2])[lVar17].mag / local_9f8._0_4_) * local_9e0
                           );
            pcStack_a00 = (code *)0x10500c;
            fVar22 = psi_error((*padVar2)[lVar17],(*local_9c8)[uVar19 + lVar14]);
            *local_9d8 = *local_9d8 + ((float)local_9f0 - fVar22) * ((float)local_9f0 - fVar22);
            if (local_9e8._0_4_ <= (int)uVar12) {
              uVar12 = uVar9;
            }
            lVar17 = (long)(int)uVar12;
            local_4e8[lVar17 * 3] =
                 local_4e8[lVar17 * 3] +
                 (local_4e8[lVar17 * 3 + 1] - fVar22) * (local_4e8[lVar17 * 3 + 1] - fVar22);
            if (-1 < (int)uVar12) {
              lVar17 = 0;
              do {
                fVar20 = *(float *)((long)local_998 + lVar17 + 4) - fVar22;
                *(float *)((long)local_998 + lVar17) =
                     *(float *)((long)local_998 + lVar17) + fVar20 * fVar20;
                lVar17 = lVar17 + 0xc;
              } while ((ulong)uVar12 * 0xc + 0xc != lVar17);
            }
          }
          uVar19 = uVar19 + 1;
        } while ((long)uVar19 < (long)((f->sizx - KERNEL_X) + -9));
      }
      uVar18 = uVar18 + 1;
    } while ((long)uVar18 < (long)((f->sizy - KERNEL_Y) + -9));
  }
  fVar22 = *local_9d8 / local_9dc;
  if (fVar22 < 0.0) {
    pcStack_a00 = (code *)0x105127;
    fVar22 = sqrtf(fVar22);
  }
  else {
    fVar22 = SQRT(fVar22);
  }
  uVar4 = local_9d0;
  dVar21 = local_9e8;
  *local_9d8 = fVar22;
  iVar5 = SUB84(local_9e8,0);
  if (0 < iVar5) {
    uVar10 = local_9d0 * 0xc;
    uVar18 = 0;
    do {
      if (*(int *)((long)local_4e0 + uVar18) != 0) {
        fVar22 = *(float *)((long)local_4e8 + uVar18) / (float)*(int *)((long)local_4e0 + uVar18);
        if (fVar22 < 0.0) {
          pcStack_a00 = (code *)0x105186;
          fVar22 = sqrtf(fVar22);
        }
        else {
          fVar22 = SQRT(fVar22);
        }
        *(float *)((long)local_4e8 + uVar18) = fVar22;
      }
      if (*(int *)((long)local_990 + uVar18) != 0) {
        fVar22 = *(float *)((long)local_998 + uVar18) / (float)*(int *)((long)local_990 + uVar18);
        if (fVar22 < 0.0) {
          pcStack_a00 = (code *)0x1051be;
          fVar22 = sqrtf(fVar22);
        }
        else {
          fVar22 = SQRT(fVar22);
        }
        *(float *)((long)local_998 + uVar18) = fVar22;
      }
      uVar18 = uVar18 + 0xc;
    } while (uVar10 != uVar18);
  }
  pcVar15 = "w";
  pcStack_a00 = (code *)0x1051e2;
  ptVar6 = local_9a0;
  __stream = fopen((char *)local_9a0,"w");
  if (__stream == (FILE *)0x0) {
    pcStack_a00 = write_velocity;
    prod_histo_cold_1();
    pcStack_a00 = (code *)uVar4;
    dStack_a18 = dVar21;
    q = (qnode_ptr_t)0x180;
    uStack_a28 = uVar10;
    ptStack_a20 = f;
    uStack_a10 = uVar18;
    uStack_a08 = uVar19;
    iVar5 = creat((char *)ptVar6,0x180);
    if (iVar5 < 1) {
      write_velocity_cold_1();
      iVar5 = q->ofst;
      iVar8 = q->sizy - iVar5;
      q_00 = q;
      iVar13 = iVar5;
      if (iVar5 < iVar8) {
        do {
          for (; iVar5 < q->sizx - q->ofst; iVar5 = iVar5 + 1) {
            if (0 < q->sizz) {
              lVar14 = 0;
              do {
                fVar22 = dx(ptVar6,q,iVar13,iVar5,(int)lVar14);
                (*q->param_ptr[lVar14])[q->res * iVar13 + iVar5].fx = fVar22;
                q_00 = q;
                fVar22 = dy(ptVar6,q,iVar13,iVar5,(int)lVar14);
                (*q->param_ptr[lVar14])[q->res * iVar13 + iVar5].fy = fVar22;
                lVar14 = lVar14 + 1;
              } while (lVar14 < q->sizz);
            }
          }
          iVar13 = iVar13 + 1;
          iVar5 = q->ofst;
          iVar8 = q->sizy - iVar5;
        } while (iVar13 < iVar8);
      }
      iVar13 = ptVar6->sizz / 2;
      if (iVar5 < iVar8) {
        iVar1 = q->sizx;
        iStack_a98 = iVar5;
        do {
          if (iVar5 < iVar1 - iVar5) {
            piVar11 = &(*q->param_ptr[iVar13])[(long)iStack_a98 * (long)q->res + (long)iVar5].err;
            iVar16 = iVar1 + iVar5 * -2;
            y = iVar5;
            do {
              if (*piVar11 == 0) {
                fVar22 = dt(ptVar6,q_00,iStack_a98,y);
                piVar11[-4] = (int)fVar22;
              }
              y = y + 1;
              piVar11 = piVar11 + 8;
              iVar16 = iVar16 + -1;
            } while (iVar16 != 0);
          }
          iStack_a98 = iStack_a98 + 1;
        } while (iStack_a98 != iVar8);
      }
      if ((extraout_EDX == 0) && (iVar8 = q->ofst, iVar5 < q->sizy - iVar8)) {
        do {
          if (iVar8 < q->sizx - q->ofst) {
            lVar17 = (long)iVar8;
            lVar14 = (long)iVar5;
            do {
              if ((*q->param_ptr[iVar13])[q->res * lVar14 + lVar17].err == 0) {
                iVar8 = (int)lVar17;
                fVar22 = dxx(q,iVar5,iVar8,iVar13);
                (*q->param_ptr[iVar13])[q->res * lVar14 + lVar17].fxx = fVar22;
                fVar22 = dyy(q,iVar5,iVar8,iVar13);
                (*q->param_ptr[iVar13])[q->res * lVar14 + lVar17].fyy = fVar22;
                fVar22 = dxy(q,iVar5,iVar8,iVar13);
                (*q->param_ptr[iVar13])[q->res * lVar14 + lVar17].fxy = fVar22;
              }
              lVar17 = lVar17 + 1;
            } while ((int)lVar17 < q->sizx - q->ofst);
          }
          iVar5 = iVar5 + 1;
          iVar8 = q->ofst;
        } while (iVar5 < q->sizy - iVar8);
      }
      iVar5 = q->ofst;
      if (iVar5 < q->sizy - iVar5) {
        iVar8 = iVar5;
        do {
          if (iVar5 < q->sizx - q->ofst) {
            lVar14 = (long)iVar5;
            do {
              papVar3 = q->param_ptr[iVar13];
              lVar17 = (long)q->res * (long)iVar8 + lVar14;
              if ((*papVar3)[lVar17].err == 0) {
                dVar23 = (double)(*papVar3)[lVar17].fx;
                dVar21 = (double)(*papVar3)[lVar17].fy;
                dVar21 = dVar21 * dVar21 + dVar23 * dVar23;
                if (dVar21 < 0.0) {
                  dVar21 = sqrt(dVar21);
                }
                else {
                  dVar21 = SQRT(dVar21);
                }
                (*q->param_ptr[iVar13])[(long)q->res * (long)iVar8 + lVar14].mag = (float)dVar21;
              }
              lVar14 = lVar14 + 1;
            } while ((int)lVar14 < q->sizx - q->ofst);
          }
          iVar8 = iVar8 + 1;
          iVar5 = q->ofst;
        } while (iVar8 < q->sizy - iVar5);
      }
      return;
    }
    fStack_a2c = (float)*(int *)((long)pcVar15 + 4);
    fStack_a30 = (float)*(int *)((long)pcVar15 + 8);
    write(iVar5,&fStack_a2c,4);
    write(iVar5,&fStack_a30,4);
    fStack_a2c = (float)(*(int *)((long)pcVar15 + 4) + KERNEL_X * -2 + -0x12);
    fStack_a30 = (float)(*(int *)((long)pcVar15 + 8) + KERNEL_Y * -2 + -0x12);
    write(iVar5,&fStack_a2c,4);
    write(iVar5,&fStack_a30,4);
    fStack_a2c = (float)(KERNEL_X + 9);
    fStack_a30 = (float)(KERNEL_Y + 9);
    write(iVar5,&fStack_a2c,4);
    write(iVar5,&fStack_a30,4);
    iStack_a34 = KERNEL_Y + 9;
    if (iStack_a34 < (*(int *)((long)pcVar15 + 8) - KERNEL_Y) + -9) {
      do {
        if (KERNEL_X + 9 < (*(int *)((long)pcVar15 + 4) - KERNEL_X) + -9) {
          lVar14 = (long)KERNEL_X + 9;
          do {
            lVar17 = (long)*(int *)pcVar15 * (long)iStack_a34 + lVar14;
            fStack_a2c = *(float *)(*(long *)((long)pcVar15 + 0x158) + 4 + lVar17 * 8);
            fStack_a30 = -*(float *)(*(long *)((long)pcVar15 + 0x158) + lVar17 * 8);
            write(iVar5,&fStack_a2c,4);
            write(iVar5,&fStack_a30,4);
            lVar14 = lVar14 + 1;
          } while ((int)lVar14 < (*(int *)((long)pcVar15 + 4) - KERNEL_X) + -9);
        }
        iStack_a34 = iStack_a34 + 1;
      } while (iStack_a34 < (*(int *)((long)pcVar15 + 8) - KERNEL_Y) + -9);
    }
    close(iVar5);
    return;
  }
  local_9f0 = (double)CONCAT44(local_9f0._4_4_,(float)local_990[0]);
  pcStack_a00 = (code *)0x105213;
  fprintf(__stream,"%2d\n",2);
  pcStack_a00 = (code *)0x105227;
  fprintf(__stream,"%3d\n",(ulong)dVar21 & 0xffffffff);
  local_9c8 = (disp_field512_t *)((double)local_9bc * -0.5 + (double)local_9f8._0_4_);
  pcStack_a00 = (code *)0x10525b;
  fprintf(__stream,"%5.7f\n");
  fVar22 = local_9f8._0_4_ / local_9e0;
  local_9f8 = (char *)CONCAT44(local_9f8._4_4_,fVar22);
  if (0 < iVar5) {
    local_9e8 = (double)fVar22 * 0.5;
    piVar11 = local_4e0;
    uVar10 = 0;
    do {
      pcStack_a00 = (code *)0x1052db;
      fprintf(__stream,"%5.7f %10.7f %10.7f %3.7f\n",
              (double)((float)(int)uVar10 * fVar22) + local_9e8,(double)(float)piVar11[-1],
              (double)(float)piVar11[-2],(double)((float)*piVar11 / (float)local_9f0));
      uVar10 = uVar10 + 1;
      piVar11 = piVar11 + 3;
      fVar22 = local_9f8._0_4_;
    } while (uVar4 != uVar10);
  }
  pcStack_a00 = (code *)0x105305;
  fwrite("\n\n\n",3,1,__stream);
  pcStack_a00 = (code *)0x105319;
  fprintf(__stream,"%3d\n",(ulong)dVar21 & 0xffffffff);
  pcStack_a00 = (code *)0x105330;
  fprintf(__stream,"%5.7f\n",local_9c8);
  if (0 < iVar5) {
    local_9e8 = (double)local_9f8._0_4_ * 0.5;
    piVar11 = local_990;
    uVar10 = 0;
    do {
      pcStack_a00 = (code *)0x1053a5;
      fprintf(__stream,"%5.7f %10.7f %10.7f %3.7f\n",
              (double)((float)(int)uVar10 * local_9f8._0_4_) + local_9e8,(double)(float)piVar11[-1],
              (double)(float)piVar11[-2],(double)((float)*piVar11 / (float)local_9f0));
      uVar10 = uVar10 + 1;
      piVar11 = piVar11 + 3;
    } while (uVar4 != uVar10);
  }
  fclose(__stream);
  return;
}

Assistant:

void prod_histo(f,c_fn,h_fn,nbin,incr,ttl_err,ttl_std,dens)
qnode_ptr_t f ;
string c_fn, h_fn ;
float incr, *ttl_err, *ttl_std, *dens ;
int nbin ;

{ qnode_ptr_t create_node(), q ;
  disp_vect_t u ;
  histo_t histo1[N_BINS], c_histo1[N_BINS] ;
  float psi_error(), max_mag, mag, err, avg_err, density, t, x, y ;
  int fdf, nbytes, i, j, k, index1, ttl_freq, abs_freq ;
  FILE *fdp ;
  extern int KERNEL_X, KERNEL_Y ;

  q = create_node(0,f->res,f->sizx,f->sizy,f->sizz,0) ;
  q->flow_ptr = (disp_field512_t *)malloc(sizeof(disp_field512_t)) ;
  load_velocity(q,c_fn) ;

  max_mag = incr*(float)nbin ;
  for (i = 0 ; i < N_BINS ; i++) {
    histo1[i].avg = 0.0 ;
    histo1[i].std = 0.0 ;
    histo1[i].freq = 0 ;
    c_histo1[i].avg = 0.0 ;
    c_histo1[i].std = 0.0 ;
    c_histo1[i].freq = 0 ;
  }
  abs_freq = 0 ;
  ttl_freq = 0 ;
  avg_err = 0.0 ;
  *ttl_err = 0.0 ;
  *ttl_std = 0.0 ;

  for (i = KERNEL_Y + NRADIUS ; i < f->sizy - KERNEL_Y - NRADIUS ; i++) {
    for (j = KERNEL_X + NRADIUS ; j < f->sizx -  KERNEL_X - NRADIUS ; j++) {
      mag = (*f->param_ptr[f->sizz/2])[f->res*i + j].mag ;
      index1 = (int)((mag/max_mag)*(float)nbin) ;
      u = (*f->flow_ptr)[f->res*i+j] ;
      abs_freq++ ;
      if (u.x != -100.0 && u.y != 100.0) {
        err = psi_error((*f->flow_ptr)[f->res*i+j],(*q->flow_ptr)[q->res*i+j]) ;
        avg_err += err ;
        ttl_freq++ ;
        if (index1 >= nbin) {
          index1 = nbin - 1 ;
        }
        histo1[index1].avg += err ;
        histo1[index1].freq++ ;
        for (k = 0 ; k <= index1 ; k++) {
          c_histo1[k].avg += err ;
          c_histo1[k].freq++ ;
        }
      }
    }
  }
  if (abs_freq != 0) {
    *dens = (float)ttl_freq/(float)abs_freq ;
  }
  else {
    *dens = 0.0 ;
  }
  *ttl_err = avg_err/(float)ttl_freq ;
  avg_err = *ttl_err ;
  for (i = 0 ; i < nbin ; i++) {
    if (histo1[i].freq != 0) {
      histo1[i].avg /= (float)histo1[i].freq ;
    }
    if (c_histo1[i].freq != 0) {
      c_histo1[i].avg /= (float)c_histo1[i].freq ;
    }
  }
  for (i = KERNEL_Y + NRADIUS ; i < f->sizy - KERNEL_Y - NRADIUS ; i++) {
    for (j = KERNEL_X + NRADIUS ; j < f->sizx - KERNEL_X - NRADIUS ; j++) {
      mag = (*f->param_ptr[f->sizz/2])[f->res*i + j].mag ;
      index1 = (int)((mag/max_mag)*(float)nbin) ;
      u = (*f->flow_ptr)[f->res*i+j] ;
      if (u.x != -100.0 && u.y != 100.0) {
        err = psi_error((*f->flow_ptr)[f->res*i+j],(*q->flow_ptr)[q->res*i+j]) ;
        *ttl_std += pow(avg_err - err,2.0) ;
        if (index1 >= nbin) {
          index1 = nbin - 1 ;
        }
        histo1[index1].std += pow(histo1[index1].avg - err,2.0) ;
        for (k = 0 ; k <= index1 ; k++) {
          c_histo1[k].std += pow(c_histo1[k].avg - err,2.0) ;
        }
      }
    }
  }
  *ttl_std = sqrt(*ttl_std/(float)ttl_freq) ;
  for (i = 0 ; i < nbin ; i++) {
    if (histo1[i].freq != 0) {
      histo1[i].std = sqrt(histo1[i].std/(float)histo1[i].freq) ;
    }
    if (c_histo1[i].freq != 0) {
      c_histo1[i].std = sqrt(c_histo1[i].std/(float)c_histo1[i].freq) ;
    }
  }
  if ((fdp = fopen(h_fn,"w")) == NULL) {
    error(7) ;
  }

  density = c_histo1[0].freq ;
  fprintf(fdp,"%2d\n",N_HISTO) ;
  fprintf(fdp,"%3d\n",nbin) ;
  fprintf(fdp,"%5.7f\n",max_mag - incr/2.0) ;
  for (i = 0 ; i < nbin ; i++) {
    t = max_mag/(float)nbin ;
    fprintf(fdp,"%5.7f %10.7f %10.7f %3.7f\n", t*(float)(i)+t/2.0,
    histo1[i].avg, histo1[i].std, (float)histo1[i].freq/density) ;
  }
  fprintf(fdp,"\n\n\n") ;

  fprintf(fdp,"%3d\n",nbin) ;
  fprintf(fdp,"%5.7f\n",max_mag - incr/2.0) ;
  for (i = 0 ; i < nbin ; i++) {
    t = max_mag/(float)nbin ;
    fprintf(fdp,"%5.7f %10.7f %10.7f %3.7f\n", t*(float)(i)+t/2.0,
    c_histo1[i].avg, c_histo1[i].std, (float)c_histo1[i].freq/density) ;
  }
  fclose(fdp) ;
}